

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O1

Vec4 __thiscall tcu::linearToSRGBIfNeeded(tcu *this,TextureFormat *format,Vec4 *color)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 in_XMM1_Qa;
  Vec4 VVar5;
  float fVar4;
  
  if (format->order - sR < 6) {
    VVar5 = linearToSRGB(this,color);
    in_XMM1_Qa = VVar5.m_data._8_8_;
    fVar3 = VVar5.m_data[0];
    fVar4 = VVar5.m_data[1];
  }
  else {
    fVar3 = color->m_data[0];
    fVar4 = color->m_data[1];
    fVar1 = color->m_data[2];
    fVar2 = color->m_data[3];
    *(float *)this = fVar3;
    *(float *)(this + 4) = fVar4;
    *(float *)(this + 8) = fVar1;
    *(float *)(this + 0xc) = fVar2;
  }
  VVar5.m_data[1] = fVar4;
  VVar5.m_data[0] = fVar3;
  VVar5.m_data[2] = (float)(int)in_XMM1_Qa;
  VVar5.m_data[3] = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  return (Vec4)VVar5.m_data;
}

Assistant:

tcu::Vec4 linearToSRGBIfNeeded (const TextureFormat& format, const tcu::Vec4& color)
{
	return isSRGB(format) ? linearToSRGB(color) : color;
}